

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O0

void __thiscall fineftp::FtpSession::sendRawFtpMessage(FtpSession *this,string *raw_message)

{
  anon_class_48_2_3c81cf3a_for_handler_ local_48;
  string *local_18;
  string *raw_message_local;
  FtpSession *this_local;
  
  local_18 = (string *)raw_message;
  raw_message_local = (string *)this;
  std::enable_shared_from_this<fineftp::FtpSession>::shared_from_this
            ((enable_shared_from_this<fineftp::FtpSession> *)&local_48);
  ::std::__cxx11::string::string((string *)&local_48.raw_message,local_18);
  asio::io_context::strand::
  post<fineftp::FtpSession::sendRawFtpMessage(std::__cxx11::string_const&)::__0>
            (&this->command_write_strand_,&local_48);
  sendRawFtpMessage(std::__cxx11::string_const&)::$_0::~__0((__0 *)&local_48);
  return;
}

Assistant:

void FtpSession::sendRawFtpMessage(const std::string& raw_message)
  {
    command_write_strand_.post([me = shared_from_this(), raw_message]()
                                {
                                  bool write_in_progress = !me->command_output_queue_.empty();
                                  me->command_output_queue_.push_back(raw_message);
                                  if (!write_in_progress)
                                  {
                                    me->startSendingMessages();
                                  }
                                });
  }